

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O1

int Cec_ManPatCollectTry(Vec_Ptr_t *vInfo,Vec_Ptr_t *vPres,int iBit,int *pLits,int nLits)

{
  uint *puVar1;
  void *pvVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  iVar4 = iBit >> 5;
  if (0 < nLits) {
    bVar3 = (byte)iBit & 0x1f;
    uVar6 = 0;
    do {
      uVar7 = pLits[uVar6];
      if ((int)uVar7 < 0) goto LAB_0090b53a;
      uVar8 = uVar7 >> 1;
      if ((vInfo->nSize <= (int)uVar8) || (vPres->nSize <= (int)uVar8)) goto LAB_0090b51b;
      if (((*(uint *)((long)vPres->pArray[uVar8] + (long)iVar4 * 4) & 1 << bVar3) != 0) &&
         (((*(uint *)((long)vInfo->pArray[uVar8] + (long)iVar4 * 4) >> bVar3 ^ uVar7) & 1) == 0)) {
        return 0;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)nLits != uVar6);
  }
  if (0 < nLits) {
    bVar3 = (byte)iBit & 0x1f;
    uVar7 = 1 << bVar3;
    lVar5 = (long)iVar4;
    uVar6 = 0;
    do {
      if (pLits[uVar6] < 0) {
LAB_0090b53a:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar8 = (uint)pLits[uVar6] >> 1;
      if ((vInfo->nSize <= (int)uVar8) || (vPres->nSize <= (int)uVar8)) {
LAB_0090b51b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = vInfo->pArray[uVar8];
      puVar1 = (uint *)((long)vPres->pArray[uVar8] + lVar5 * 4);
      *puVar1 = *puVar1 | uVar7;
      if (pLits[uVar6] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      uVar8 = *(uint *)((long)pvVar2 + lVar5 * 4);
      if (((uVar8 >> bVar3 ^ pLits[uVar6]) & 1) == 0) {
        *(uint *)((long)pvVar2 + lVar5 * 4) = uVar8 ^ uVar7;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)nLits != uVar6);
  }
  return 1;
}

Assistant:

int Cec_ManPatCollectTry( Vec_Ptr_t * vInfo, Vec_Ptr_t * vPres, int iBit, int * pLits, int nLits )
{
    unsigned * pInfo, * pPres;
    int i;
    for ( i = 0; i < nLits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry(vInfo, Abc_Lit2Var(pLits[i]));
        pPres = (unsigned *)Vec_PtrEntry(vPres, Abc_Lit2Var(pLits[i]));
        if ( Abc_InfoHasBit( pPres, iBit ) && 
             Abc_InfoHasBit( pInfo, iBit ) == Abc_LitIsCompl(pLits[i]) )
             return 0;
    }
    for ( i = 0; i < nLits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry(vInfo, Abc_Lit2Var(pLits[i]));
        pPres = (unsigned *)Vec_PtrEntry(vPres, Abc_Lit2Var(pLits[i]));
        Abc_InfoSetBit( pPres, iBit );
        if ( Abc_InfoHasBit( pInfo, iBit ) == Abc_LitIsCompl(pLits[i]) )
            Abc_InfoXorBit( pInfo, iBit );
    }
    return 1;
}